

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aria_ccm_hw.c
# Opt level: O0

int ccm_aria_initkey(PROV_CCM_CTX *ctx,uchar *key,size_t keylen)

{
  long in_RDX;
  CCM128_CONTEXT *in_RSI;
  byte *in_RDI;
  PROV_ARIA_CCM_CTX *actx;
  block128_f in_stack_ffffffffffffffd8;
  byte *key_00;
  
  key_00 = in_RDI;
  ossl_aria_set_encrypt_key((uchar *)in_RSI,(int)(in_RDX << 3),(ARIA_KEY *)(in_RDI + 0x98));
  CRYPTO_ccm128_init(in_RSI,(uint)((ulong)in_RDX >> 0x20),(uint)in_RDX,key_00,
                     in_stack_ffffffffffffffd8);
  in_RDI[0x88] = 0;
  in_RDI[0x89] = 0;
  in_RDI[0x8a] = 0;
  in_RDI[0x8b] = 0;
  in_RDI[0x8c] = 0;
  in_RDI[0x8d] = 0;
  in_RDI[0x8e] = 0;
  in_RDI[0x8f] = 0;
  *in_RDI = *in_RDI & 0xfd | 2;
  return 1;
}

Assistant:

static int ccm_aria_initkey(PROV_CCM_CTX *ctx,
                            const unsigned char *key, size_t keylen)
{
    PROV_ARIA_CCM_CTX *actx = (PROV_ARIA_CCM_CTX *)ctx;

    ossl_aria_set_encrypt_key(key, keylen * 8, &actx->ks.ks);
    CRYPTO_ccm128_init(&ctx->ccm_ctx, ctx->m, ctx->l, &actx->ks.ks,
                       (block128_f)ossl_aria_encrypt);
    ctx->str = NULL;
    ctx->key_set = 1;
    return 1;
}